

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_text_t * bov_text_new(GLubyte *string,GLenum usage)

{
  GLsizei GVar1;
  size_t sVar2;
  GLfloat *pGVar3;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  bov_text_t *local_20;
  bov_text_t *text;
  GLubyte *pGStack_10;
  GLenum usage_local;
  GLubyte *string_local;
  
  text._4_4_ = usage;
  pGStack_10 = string;
  local_20 = (bov_text_t *)malloc(0x60);
  if (local_20 == (bov_text_t *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_text_new",0x472);
    exit(1);
  }
  local_60 = 0;
  local_5c = 0;
  local_58 = 0;
  local_54 = 0x3f800000;
  local_50 = 0x3f800000;
  local_4c = 0x3f800000;
  local_48 = 0x3f800000;
  local_44 = 0x40000000;
  local_40 = 0;
  local_3c = 0;
  local_38 = 0;
  local_34 = 0;
  local_30 = 0x3d4ccccd;
  local_2c = 0;
  local_28 = 0xbf800000;
  local_24 = 0;
  memcpy(&local_20->param,&local_60,0x40);
  (*glad_glGenVertexArrays)(1,&local_20->vao);
  (*glad_glBindVertexArray)(local_20->vao);
  (*glad_glGenBuffers)(1,&local_20->vbo);
  (*glad_glBindBuffer)(0x8892,local_20->vbo);
  (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0x10,(void *)0x0);
  (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0x10,(void *)0x8);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glEnableVertexAttribArray)(1);
  if (pGStack_10 == (GLubyte *)0x0) {
    local_20->vboLen = 0;
    local_20->vboCapacity = 0;
    local_20->data = (GLfloat *)0x0;
    local_20->dataCapacity = 0;
  }
  else {
    sVar2 = strlen((char *)pGStack_10);
    local_20->dataCapacity = (GLsizei)sVar2;
    pGVar3 = (GLfloat *)malloc((long)local_20->dataCapacity * 0x60);
    local_20->data = pGVar3;
    if (local_20->data == (GLfloat *)0x0) {
      bov_error_log(0x30001,"Memory allocation failed");
      fprintf(_stderr,"\t(in function %s, line %d)\n","bov_text_new",0x49f);
      exit(1);
    }
    GVar1 = fill_text_data(local_20->data,pGStack_10,local_20->dataCapacity);
    local_20->vboLen = GVar1;
    (*glad_glBufferData)(0x8892,(long)local_20->vboLen * 0x60,local_20->data,text._4_4_);
    local_20->vboCapacity = local_20->vboLen;
  }
  return local_20;
}

Assistant:

bov_text_t* bov_text_new(const GLubyte* string, GLenum usage)
{
	bov_text_t* text = malloc(sizeof(bov_text_t));
	CHECK_MALLOC(text);

	text->param = (bov_text_param_t) {
		.fillColor = {0.0f, 0.0f, 0.0f, 1.0f},
		.outlineColor = {1.0f ,1.0f, 1.0f, 2.0f},
		.pos = {0.0f, 0.0f},
		.shift = {0.0f, 0.0f},
		.fontSize = 0.05f,
		.boldness = 0.0f,
		.outlineWidth = -1.0f,
		.spaceType = USUAL_SPACE};

	// Create Vertex Array Object
	glGenVertexArrays(1, &text->vao);
	glBindVertexArray(text->vao);

	// Vertex Buffer Object
	glGenBuffers(1, &text->vbo);
	glBindBuffer(GL_ARRAY_BUFFER, text->vbo);

	// specify the layout of the data
	glVertexAttribPointer(POS_LOCATION,
	                      2,
	                      GL_FLOAT,
	                      GL_FALSE,
	                      4 * sizeof(GLfloat),
	                      0);
	glVertexAttribPointer(TEX_LOCATION,
	                      2,
	                      GL_FLOAT,
	                      GL_FALSE,
	                      4 * sizeof(GLfloat),
	                      (void*)(2 * sizeof(GLfloat)));
	glEnableVertexAttribArray(POS_LOCATION);
	glEnableVertexAttribArray(TEX_LOCATION);

	if(string!=NULL) {
		text->dataCapacity = (GLsizei) strlen((const char *)string);

		// data for text contain... 4 vertex per letter
		// for each letter, we must have
		// 2 screen coordinates      4f
		// 2 texture coordinates     4f

		text->data = malloc(sizeof(GLfloat) * 24 * text->dataCapacity);
		CHECK_MALLOC(text->data);

		// text->string = string;

		text->vboLen = fill_text_data(text->data,
		                              string,
		                              text->dataCapacity);
		glBufferData(GL_ARRAY_BUFFER,
		             sizeof(GLfloat) * 24 * text->vboLen,
		             text->data,
		             usage);
		text->vboCapacity = text->vboLen;
	}
	else {
		text->vboLen = 0;
		text->vboCapacity = 0;
		text->data = NULL;
		text->dataCapacity = 0;
	}

	// glBindBuffer(GL_ARRAY_BUFFER, 0);
	// glBindVertexArray(0);

	return text;
}